

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O1

void __thiscall Dashel::StdinStream::StdinStream(StdinStream *this,string *targetName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_38;
  
  paVar1 = &local_38.field_2;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"file","");
  Stream::Stream((Stream *)
                 &(this->super_FileStream).super_FileDescriptorStream.super_DisconnectableStream.
                  field_0x1020,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"file:name=/dev/stdin;mode=read;fd=0","");
  FileStream::FileStream(&this->super_FileStream,&PTR_construction_vtable_24__00121978,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  (this->super_FileStream).super_FileDescriptorStream.super_DisconnectableStream.
  super_SelectableStream._vptr_SelectableStream = (_func_int **)0x1218e0;
  *(undefined8 *)
   &(this->super_FileStream).super_FileDescriptorStream.super_DisconnectableStream.field_0x1020 =
       0x121948;
  return;
}

Assistant:

explicit StdinStream(const string& targetName) :
			Stream("file"),
			FileStream("file:name=/dev/stdin;mode=read;fd=0") {}